

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleConfigLoader.cpp
# Opt level: O3

char * __thiscall SimpleConfigLoader::trimString(SimpleConfigLoader *this,char *text)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *__dest;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  
  if (text != (char *)0x0) {
    sVar3 = strlen(text);
    uVar7 = (uint)sVar3;
    iVar8 = uVar7 - 1;
    if (iVar8 < 0) {
      uVar7 = 0;
    }
    else {
      uVar5 = 0;
      do {
        iVar1 = isspace((int)text[uVar5]);
        if (iVar1 == 0) {
          uVar7 = (uint)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
      } while ((sVar3 & 0xffffffff) != uVar5);
    }
    iVar1 = iVar8;
    if ((int)uVar7 <= iVar8) {
      lVar6 = (long)iVar8 + 1;
      do {
        iVar2 = isspace((int)text[lVar6 + -1]);
        iVar1 = iVar8;
        if (iVar2 == 0) break;
        iVar8 = iVar8 + -1;
        lVar6 = lVar6 + -1;
        iVar1 = uVar7 - 1;
      } while ((int)uVar7 < lVar6);
    }
    iVar1 = iVar1 - uVar7;
    if ((-1 < iVar1) && (__dest = malloc((ulong)(iVar1 + 2)), __dest != (void *)0x0)) {
      *(undefined1 *)((long)__dest + (ulong)(iVar1 + 1)) = 0;
      pcVar4 = (char *)memcpy(__dest,text + uVar7,(ulong)(iVar1 + 1));
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

char* SimpleConfigLoader::trimString(char* text)
{
	if (text == NULL)
	{
		return NULL;
	}

	int startPos = 0;
	int endPos = strlen(text) - 1;

	// Find the first position without a space
	while (startPos <= endPos && isspace((int)*(text + startPos)))
	{
		startPos++;
	}
	// Find the last position without a space
	while (startPos <= endPos && isspace((int)*(text + endPos)))
	{
		endPos--;
	}

	// We must have a valid string
	int length = endPos - startPos + 1;
	if (length <= 0)
	{
		return NULL;
	}

	// Create the trimmed text
	char* trimmedText = (char*)malloc(length + 1);
	if (trimmedText == NULL)
	{
		return NULL;
	}
	trimmedText[length] = '\0';
	memcpy(trimmedText, text + startPos, length);

	return trimmedText;
}